

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

uint ON_Font::Internal_FontCharacteristicsAsUnsigned
               (Weight font_weight,Style font_style,Stretch font_stretch,bool bUnderlined,
               bool bStrikethrough)

{
  undefined7 in_register_00000009;
  long lVar1;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  uint uVar2;
  undefined7 in_register_00000081;
  ulong uVar3;
  bool bVar4;
  uint a [6] [2];
  
  uVar3 = CONCAT71(in_register_00000081,bStrikethrough);
  a[0][0] = 2;
  a[0][1] = 1;
  a[1][0] = 10;
  a[1][1] = (uint)CONCAT71(in_register_00000039,font_weight);
  a[2][0] = 4;
  a[2][1] = (uint)CONCAT71(in_register_00000031,font_style);
  a[3][0] = 10;
  a[3][1] = (uint)CONCAT71(in_register_00000011,font_stretch);
  a[4][0] = 2;
  a[4][1] = (uint)CONCAT71(in_register_00000009,bUnderlined);
  a[5][0] = 2;
  lVar1 = 4;
  do {
    uVar2 = a[lVar1][1] % a[lVar1][0] + (int)uVar3 * a[lVar1][0];
    uVar3 = (ulong)uVar2;
    bVar4 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar4);
  return uVar2;
}

Assistant:

unsigned int ON_Font::Internal_FontCharacteristicsAsUnsigned(
  ON_Font::Weight font_weight,
  ON_Font::Style font_style,
  ON_Font::Stretch font_stretch,
  bool bUnderlined,
  bool bStrikethrough
  )
{
  unsigned int a[][2]
    = {
      { 2U, 1U }, // insures 0 is not a valid FontCharacteristicsAsUnsigned() value.
      { 10U, static_cast<unsigned int>(font_weight) },
      { 4U, static_cast<unsigned int>(font_style) },
      { 10U, static_cast<unsigned int>(font_stretch) },
      // The static_cast<unsigned int> in b ? 1U : 0U is to work around a CLang compiler bug.
      { 2U, static_cast<unsigned int>(bUnderlined ? 1U : 0U) },
      { 2U, static_cast<unsigned int>(bStrikethrough ? 1U : 0U) }
      // insert new information below this line.
  };

  const int count = (int)(sizeof(a) / sizeof(a[0]));
  int i = count-1;
  unsigned int u = a[i][1] % a[i][0];

  for (i--; i >= 0; i--)
  {
    u = (u * a[i][0]) + (a[i][1] % a[i][0]);
  }

  return u;
}